

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string_view package_name)

{
  bool bVar1;
  string_view text;
  
  text._M_str = (file->package_->_M_dataplus)._M_p;
  text._M_len = file->package_->_M_string_length;
  bVar1 = absl::lts_20250127::StartsWith(text,package_name);
  if (bVar1) {
    bVar1 = true;
    if (file->package_->_M_string_length != package_name._M_len) {
      bVar1 = (file->package_->_M_dataplus)._M_p[package_name._M_len] == '.';
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    absl::string_view package_name) {
  return absl::StartsWith(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}